

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  long *plVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  BYTE *mEnd;
  BYTE *pBVar6;
  U32 *pUVar7;
  U32 *pUVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  U32 UVar12;
  uint uVar13;
  size_t sVar14;
  byte bVar15;
  uint uVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  uint uVar19;
  ulong uVar20;
  long *plVar21;
  uint uVar22;
  long lVar24;
  int iVar25;
  U32 UVar26;
  BYTE *iStart;
  BYTE *pBVar27;
  ulong uVar28;
  long *plVar29;
  U32 prefixStartIndex;
  U32 UVar30;
  int *piVar31;
  U32 local_cc;
  ulong uVar23;
  
  uVar11 = (ms->cParams).targetLength;
  uVar11 = uVar11 + (uVar11 == 0);
  pBVar4 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar4 + uVar2;
  pZVar5 = ms->dictMatchState;
  uVar3 = (pZVar5->window).dictLimit;
  mEnd = (pZVar5->window).nextSrc;
  pBVar6 = (pZVar5->window).base;
  pBVar27 = pBVar6 + uVar3;
  uVar22 = ((int)pBVar6 - (int)mEnd) + uVar2;
  uVar23 = (ulong)uVar22;
  uVar13 = (ms->cParams).minMatch;
  pUVar7 = ms->hashTable;
  iEnd = (BYTE *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  pUVar8 = pZVar5->hashTable;
  plVar21 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar27) + (long)src);
  UVar26 = *rep;
  local_cc = rep[1];
  iVar25 = (int)pBVar4;
  cVar9 = (char)(ms->cParams).hashLog;
  cVar10 = (char)(pZVar5->cParams).hashLog;
  if (uVar13 == 5) {
    bVar15 = 0x40 - cVar9;
LAB_003fd7f3:
    if (plVar21 < plVar1) {
      lVar24 = *plVar21;
      uVar20 = (ulong)(lVar24 * -0x30e4432345000000) >> (bVar15 & 0x3f);
      uVar28 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar20];
      UVar30 = (U32)uVar28;
      uVar16 = (UVar30 - UVar26) + 1;
      pUVar7[uVar20] = UVar30;
      if (uVar16 - uVar2 < 0xfffffffd) {
        piVar31 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar31 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar31 != *(int *)((long)plVar21 + 1)) goto LAB_003fd85b;
        plVar29 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar31 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar26;
LAB_003fd9e2:
        UVar26 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar29);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(ulong)(*(long *)(pBVar4 + (uVar28 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                 (bVar15 & 0x3f)] = UVar30 + 2;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar15 & 0x3f)] =
               ((int)src + -2) - iVar25;
          UVar30 = UVar26;
          for (; UVar26 = UVar30, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar30 = (int)src - iVar25;
            uVar13 = UVar30 - local_cc;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if ((0xfffffffc < uVar13 - uVar2) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(ulong)(*src * -0x30e4432345000000) >> (bVar15 & 0x3f)] = UVar30;
            UVar30 = local_cc;
            local_cc = UVar26;
          }
        }
      }
      else {
LAB_003fd85b:
        if (uVar2 < uVar13) {
          piVar31 = (int *)(pBVar4 + uVar13);
          if (*piVar31 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar31;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar31 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)((long)piVar31 + lVar24) && (src < plVar29)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar31 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_003fd9b2:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_cc = UVar26;
            goto LAB_003fd9e2;
          }
        }
        else {
          uVar13 = pUVar8[(ulong)(lVar24 * -0x30e4432345000000) >> (0x40U - cVar10 & 0x3f)];
          uVar20 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar20) == (int)*plVar21)) {
            UVar12 = (UVar30 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar20 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21), pBVar27 < pBVar6 + lVar24 + uVar20 &&
                 (src < plVar29)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar20 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_003fd9b2;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      goto LAB_003fd7f3;
    }
  }
  else if (uVar13 == 6) {
    bVar15 = 0x40 - cVar9;
LAB_003fd49f:
    if (plVar21 < plVar1) {
      lVar24 = *plVar21;
      uVar20 = (ulong)(lVar24 * -0x30e4432340650000) >> (bVar15 & 0x3f);
      uVar28 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar20];
      UVar30 = (U32)uVar28;
      uVar16 = (UVar30 - UVar26) + 1;
      pUVar7[uVar20] = UVar30;
      if (uVar16 - uVar2 < 0xfffffffd) {
        piVar31 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar31 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar31 != *(int *)((long)plVar21 + 1)) goto LAB_003fd4ff;
        plVar29 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar31 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar26;
LAB_003fd689:
        UVar26 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar29);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(ulong)(*(long *)(pBVar4 + (uVar28 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                 (bVar15 & 0x3f)] = UVar30 + 2;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar15 & 0x3f)] =
               ((int)src + -2) - iVar25;
          UVar30 = UVar26;
          for (; UVar26 = UVar30, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar30 = (int)src - iVar25;
            uVar13 = UVar30 - local_cc;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if ((0xfffffffc < uVar13 - uVar2) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(ulong)(*src * -0x30e4432340650000) >> (bVar15 & 0x3f)] = UVar30;
            UVar30 = local_cc;
            local_cc = UVar26;
          }
        }
      }
      else {
LAB_003fd4ff:
        if (uVar2 < uVar13) {
          piVar31 = (int *)(pBVar4 + uVar13);
          if (*piVar31 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar31;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar31 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)((long)piVar31 + lVar24) && (src < plVar29)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar31 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_003fd659:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_cc = UVar26;
            goto LAB_003fd689;
          }
        }
        else {
          uVar13 = pUVar8[(ulong)(lVar24 * -0x30e4432340650000) >> (0x40U - cVar10 & 0x3f)];
          uVar20 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar20) == (int)*plVar21)) {
            UVar12 = (UVar30 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar20 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21), pBVar27 < pBVar6 + lVar24 + uVar20 &&
                 (src < plVar29)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar20 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_003fd659;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      goto LAB_003fd49f;
    }
  }
  else if (uVar13 == 7) {
    bVar15 = 0x40 - cVar9;
LAB_003fd133:
    if (plVar21 < plVar1) {
      lVar24 = *plVar21;
      uVar20 = (ulong)(lVar24 * -0x30e44323405a9d00) >> (bVar15 & 0x3f);
      uVar28 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar20];
      UVar30 = (U32)uVar28;
      uVar16 = (UVar30 - UVar26) + 1;
      pUVar7[uVar20] = UVar30;
      if (uVar16 - uVar2 < 0xfffffffd) {
        piVar31 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar31 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar31 != *(int *)((long)plVar21 + 1)) goto LAB_003fd193;
        plVar29 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar31 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar26;
LAB_003fd31d:
        UVar26 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar29);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(ulong)(*(long *)(pBVar4 + (uVar28 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                 (bVar15 & 0x3f)] = UVar30 + 2;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] =
               ((int)src + -2) - iVar25;
          UVar30 = UVar26;
          for (; UVar26 = UVar30, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar30 = (int)src - iVar25;
            uVar13 = UVar30 - local_cc;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if ((0xfffffffc < uVar13 - uVar2) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(ulong)(*src * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] = UVar30;
            UVar30 = local_cc;
            local_cc = UVar26;
          }
        }
      }
      else {
LAB_003fd193:
        if (uVar2 < uVar13) {
          piVar31 = (int *)(pBVar4 + uVar13);
          if (*piVar31 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar31;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar31 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)((long)piVar31 + lVar24) && (src < plVar29)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar31 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_003fd2ed:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_cc = UVar26;
            goto LAB_003fd31d;
          }
        }
        else {
          uVar13 = pUVar8[(ulong)(lVar24 * -0x30e44323405a9d00) >> (0x40U - cVar10 & 0x3f)];
          uVar20 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar20) == (int)*plVar21)) {
            UVar12 = (UVar30 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar20 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21), pBVar27 < pBVar6 + lVar24 + uVar20 &&
                 (src < plVar29)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar20 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_003fd2ed;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      goto LAB_003fd133;
    }
  }
  else {
    bVar15 = 0x20 - cVar9;
LAB_003fdb55:
    if (plVar21 < plVar1) {
      uVar19 = (uint)((int)*plVar21 * -0x61c8864f) >> (bVar15 & 0x1f);
      uVar20 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar19];
      UVar30 = (U32)uVar20;
      uVar16 = (UVar30 - UVar26) + 1;
      pUVar7[uVar19] = UVar30;
      if (uVar16 - uVar2 < 0xfffffffd) {
        piVar31 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar31 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar31 != *(int *)((long)plVar21 + 1)) goto LAB_003fdbad;
        plVar29 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar31 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar26;
LAB_003fdd38:
        UVar26 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar29);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(uint)(*(int *)(pBVar4 + (uVar20 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar15 & 0x1f)] = UVar30 + 2;
          pUVar7[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar15 & 0x1f)] =
               ((int)src + -2) - iVar25;
          UVar30 = UVar26;
          for (; UVar26 = UVar30, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar30 = (int)src - iVar25;
            uVar13 = UVar30 - local_cc;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if ((0xfffffffc < uVar13 - uVar2) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(uint)((int)*src * -0x61c8864f) >> (bVar15 & 0x1f)] = UVar30;
            UVar30 = local_cc;
            local_cc = UVar26;
          }
        }
      }
      else {
LAB_003fdbad:
        if (uVar2 < uVar13) {
          piVar31 = (int *)(pBVar4 + uVar13);
          if (*piVar31 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar31;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar31 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)((long)piVar31 + lVar24) && (src < plVar29)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar31 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_003fdd08:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_cc = UVar26;
            goto LAB_003fdd38;
          }
        }
        else {
          uVar13 = pUVar8[(uint)((int)*plVar21 * -0x61c8864f) >> (0x20U - cVar10 & 0x1f)];
          uVar28 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar28) == (int)*plVar21)) {
            UVar12 = (UVar30 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar28 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar29 = (long *)(lVar24 + (long)plVar21), pBVar27 < pBVar6 + lVar24 + uVar28 &&
                 (src < plVar29)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar28 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_003fdd08;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      goto LAB_003fdb55;
    }
  }
  *rep = UVar26;
  rep[1] = local_cc;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}